

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_severity stumpless_get_entry_severity(stumpless_entry *entry)

{
  int prival_00;
  wchar_t prival;
  stumpless_entry *entry_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local._4_4_ = ~STUMPLESS_SEVERITY_EMERG;
  }
  else {
    lock_entry(entry);
    prival_00 = entry->prival;
    unlock_entry(entry);
    clear_error();
    entry_local._4_4_ = get_severity(prival_00);
  }
  return entry_local._4_4_;
}

Assistant:

enum stumpless_severity
stumpless_get_entry_severity( const struct stumpless_entry *entry ) {
  int prival;

  if( !entry ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "entry" ) );
    return -1;
  }

  lock_entry( entry );
  prival = entry->prival;
  unlock_entry( entry );

  clear_error(  );
  return get_severity( prival );
}